

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

shared_ptr<mocker::ir::Reg> __thiscall
mocker::ir::Builder::makeReg(Builder *this,string *identifier)

{
  _List_node_base *p_Var1;
  string *hint;
  undefined8 uVar2;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  pointer unaff_R12;
  __buckets_ptr unaff_R13;
  shared_ptr<mocker::ir::Reg> sVar4;
  shared_ptr<mocker::ir::Reg> instancePtr;
  shared_ptr<mocker::ir::Reg> instancePtrPtr;
  string varName;
  string className;
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  __node_base local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  shared_ptr<mocker::ir::Reg> local_80;
  __buckets_ptr local_70;
  size_type local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  if (in_RDX->_M_string_length != 0) {
    if (*(in_RDX->_M_dataplus)._M_p == '#') {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_68 = 0;
      local_60 = 0;
      local_70 = (__buckets_ptr)&local_60;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      splitMemberVarIdent((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_c0,(Builder *)identifier,in_RDX);
      std::__cxx11::string::operator=((string *)&local_50,(string *)local_c0);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_nxt != &local_90) {
        operator_delete(local_a0._M_nxt,local_90._M_allocated_capacity + 1);
      }
      p_Var1 = (_List_node_base *)(local_c0 + 0x10);
      if ((_List_node_base *)local_c0._0_8_ != p_Var1) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
      }
      local_80.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::Reg,std::allocator<mocker::ir::Reg>,char_const(&)[5]>
                (&local_80.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(Reg **)&local_80,(allocator<mocker::ir::Reg> *)local_c0,
                 (char (*) [5])"this");
      hint = (string *)identifier->_M_string_length;
      local_c0._0_8_ = p_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"instPtr","");
      BuilderContext::makeTempLocalReg((BuilderContext *)local_d0,hint);
      if ((_List_node_base *)local_c0._0_8_ != p_Var1) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
      }
      BuilderContext::
      emplaceInst<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                ((BuilderContext *)identifier->_M_string_length,
                 (shared_ptr<mocker::ir::Reg> *)local_d0,&local_80);
      local_c0._0_8_ = local_d0._0_8_;
      local_c0._8_8_ = local_d0._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_d0._8_8_ + 8) = *(int *)(local_d0._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_d0._8_8_ + 8) = *(int *)(local_d0._8_8_ + 8) + 1;
        }
      }
      sVar4 = getMemberElementPtr(this,(shared_ptr<mocker::ir::Addr> *)identifier,(string *)local_c0
                                  ,&local_50);
      _Var3 = sVar4.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
        _Var3._M_pi = extraout_RDX_00;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
        _Var3._M_pi = extraout_RDX_01;
      }
      if (local_80.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var3._M_pi = extraout_RDX_02;
      }
      if (local_70 != (__buckets_ptr)&local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
        _Var3._M_pi = extraout_RDX_03;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
        _Var3._M_pi = extraout_RDX_04;
      }
    }
    else {
      *(undefined8 *)this = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::Reg,std::allocator<mocker::ir::Reg>,std::__cxx11::string>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->ctx,(Reg **)this,
                 (allocator<mocker::ir::Reg> *)local_c0,in_RDX);
      _Var3._M_pi = extraout_RDX;
    }
    sVar4.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var3._M_pi;
    sVar4.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<mocker::ir::Reg>)
           sVar4.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar2 = std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
  }
  if (local_80.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70 != unaff_R13) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_50._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

std::shared_ptr<Reg> Builder::makeReg(std::string identifier) const {
  if (identifier.at(0) == '@') // is global variable
    return std::make_shared<Reg>(std::move(identifier));
  if (identifier.at(0) == '#') { // is member variable
    std::string className, varName;
    std::tie(className, varName) = splitMemberVarIdent(identifier);
    auto instancePtrPtr = std::make_shared<Reg>("this");
    auto instancePtr = ctx.makeTempLocalReg("instPtr");
    ctx.emplaceInst<Load>(instancePtr, instancePtrPtr);
    return getMemberElementPtr(instancePtr, className, varName);
  }
  return std::make_shared<Reg>(std::move(identifier));
}